

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall spirv_cross::CompilerMSL::build_constant_uint_array_pointer(CompilerMSL *this)

{
  ID id;
  uint32_t uVar1;
  SPIRType *pSVar2;
  uint32_t type_ptr_ptr_id;
  SPIRType uint_type_pointer;
  SPIRType uint_type_pointer2;
  uint32_t local_2e8;
  StorageClass local_2e4;
  undefined1 local_2e0 [208];
  uint *local_210;
  size_t local_208;
  uint local_1f8 [15];
  TypeID local_1bc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  undefined1 local_180 [208];
  uint *local_b0;
  size_t local_a8;
  uint local_98 [15];
  TypeID local_5c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  id.id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
  local_2e8 = id.id + 1;
  uVar1 = get_uint_type_id(this);
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + uVar1);
  SPIRType::SPIRType((SPIRType *)local_2e0,pSVar2);
  local_2e0._12_4_ = 0x20;
  local_2e0[0x7c] = true;
  local_2e0._120_4_ = local_2e0._120_4_ + 1;
  local_1bc.id = get_uint_type_id(this);
  local_2e0._144_4_ = StorageClassUniform;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,id.id,(SPIRType *)local_2e0);
  Compiler::set_decoration((Compiler *)this,id,ArrayStride,4);
  SPIRType::SPIRType((SPIRType *)local_180,(SPIRType *)local_2e0);
  local_180._120_4_ = local_180._120_4_ + 1;
  local_5c.id = id.id;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,id.id + 1,(SPIRType *)local_180);
  local_2e4 = StorageClassUniformConstant;
  Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
            ((Compiler *)this,id.id + 2,&local_2e8,&local_2e4);
  local_180._0_8_ = &PTR__SPIRType_0048ff28;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_58);
  local_a8 = 0;
  if (local_b0 != local_98) {
    free(local_b0);
  }
  local_180._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xb0)) {
    free((void *)local_180._152_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  local_2e0._0_8_ = &PTR__SPIRType_0048ff28;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1b8);
  local_208 = 0;
  if (local_210 != local_1f8) {
    free(local_210);
  }
  local_2e0._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_2e0._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_2e0 + 0xb0)) {
    free((void *)local_2e0._152_8_);
  }
  local_2e0._96_8_ = 0;
  if ((undefined1 *)local_2e0._88_8_ != local_2e0 + 0x70) {
    free((void *)local_2e0._88_8_);
  }
  local_2e0._40_8_ = 0;
  if ((undefined1 *)local_2e0._32_8_ != local_2e0 + 0x38) {
    free((void *)local_2e0._32_8_);
  }
  return id.id + 2;
}

Assistant:

uint32_t CompilerMSL::build_constant_uint_array_pointer()
{
	uint32_t offset = ir.increase_bound_by(3);
	uint32_t type_ptr_id = offset;
	uint32_t type_ptr_ptr_id = offset + 1;
	uint32_t var_id = offset + 2;

	// Create a buffer to hold extra data, including the swizzle constants.
	SPIRType uint_type_pointer = get_uint_type();
	uint_type_pointer.op = OpTypePointer;
	uint_type_pointer.pointer = true;
	uint_type_pointer.pointer_depth++;
	uint_type_pointer.parent_type = get_uint_type_id();
	uint_type_pointer.storage = StorageClassUniform;
	set<SPIRType>(type_ptr_id, uint_type_pointer);
	set_decoration(type_ptr_id, DecorationArrayStride, 4);

	SPIRType uint_type_pointer2 = uint_type_pointer;
	uint_type_pointer2.pointer_depth++;
	uint_type_pointer2.parent_type = type_ptr_id;
	set<SPIRType>(type_ptr_ptr_id, uint_type_pointer2);

	set<SPIRVariable>(var_id, type_ptr_ptr_id, StorageClassUniformConstant);
	return var_id;
}